

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t header_gnutar(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  dev_t dVar4;
  int64_t iVar5;
  gnu_sparse *sparse;
  wchar_t wVar6;
  long local_38;
  
  wVar1 = header_common(a,tar,entry,h);
  wVar6 = L'\xffffffe2';
  wVar3 = wVar6;
  if ((((wVar1 != L'\xffffffe2') &&
       ((wVar2 = _archive_entry_copy_pathname_l(entry,(char *)h,100,tar->sconv), wVar2 == L'\0' ||
        (wVar1 = set_conversion_failed_error(a,tar->sconv,"Pathname"), wVar1 != L'\xffffffe2')))) &&
      ((wVar2 = _archive_entry_copy_uname_l(entry,(char *)((long)h + 0x109),0x20,tar->sconv),
       wVar2 == L'\0' ||
       (wVar1 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar1 != L'\xffffffe2')))) &&
     ((wVar2 = _archive_entry_copy_gname_l(entry,(char *)((long)h + 0x129),0x20,tar->sconv),
      wVar2 == L'\0' ||
      (wVar1 = set_conversion_failed_error(a,tar->sconv,"Gname"), wVar1 != L'\xffffffe2')))) {
    if ((byte)(*(char *)((long)h + 0x9c) - 0x33U) < 2) {
      dVar4 = tar_atol((char *)((long)h + 0x149),8);
      archive_entry_set_rdevmajor(entry,dVar4);
      dVar4 = tar_atol((char *)((long)h + 0x151),8);
      archive_entry_set_rdevminor(entry,dVar4);
    }
    else {
      archive_entry_set_rdev(entry,0);
    }
    tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
    iVar5 = tar_atol((char *)((long)h + 0x159),0xc);
    if (0 < iVar5) {
      archive_entry_set_atime(entry,iVar5,0);
    }
    iVar5 = tar_atol((char *)((long)h + 0x165),0xc);
    if (0 < iVar5) {
      archive_entry_set_ctime(entry,iVar5,0);
    }
    if (*(char *)((long)h + 0x1e3) != '\0') {
      iVar5 = tar_atol((char *)((long)h + 0x1e3),0xc);
      tar->realsize = iVar5;
      archive_entry_set_size(entry,iVar5);
    }
    wVar3 = wVar1;
    if (((*(char *)((long)h + 0x182) != '\0') &&
        (wVar2 = gnu_sparse_old_parse(a,tar,(gnu_sparse *)((long)h + 0x182),L'\x04'), wVar3 = wVar6,
        wVar2 == L'\0')) && (wVar3 = wVar1, *(char *)((long)h + 0x1e2) != '\0')) {
      do {
        if (*unconsumed != 0) {
          __archive_read_consume(a,*unconsumed);
          *unconsumed = 0;
        }
        sparse = (gnu_sparse *)__archive_read_ahead(a,0x200,&local_38);
        if (local_38 < 0) {
          return L'\xffffffe2';
        }
        if (local_38 < 0x200) {
          archive_set_error(&a->archive,0x54,
                            "Truncated tar archive detected while reading sparse file data");
          return L'\xffffffe2';
        }
        *unconsumed = 0x200;
        wVar3 = gnu_sparse_old_parse(a,tar,sparse,L'\x15');
        if (wVar3 != L'\0') {
          return L'\xffffffe2';
        }
      } while (sparse[0x15].offset[0] != '\0');
      wVar3 = wVar1;
      if (tar->sparse_list != (sparse_block *)0x0) {
        tar->entry_offset = tar->sparse_list->offset;
      }
    }
  }
  return wVar3;
}

Assistant:

static int
header_gnutar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	const struct archive_entry_header_gnutar *header;
	int64_t t;
	int err = ARCHIVE_OK;

	/*
	 * GNU header is like POSIX ustar, except 'prefix' is
	 * replaced with some other fields. This also means the
	 * filename is stored as in old-style archives.
	 */

	/* Grab fields common to all tar variants. */
	err = header_common(a, tar, entry, h);
	if (err == ARCHIVE_FATAL)
		return (err);

	/* Copy filename over (to ensure null termination). */
	header = (const struct archive_entry_header_gnutar *)h;
	if (archive_entry_copy_pathname_l(entry,
	    header->name, sizeof(header->name), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Fields common to ustar and GNU */
	/* XXX Can the following be factored out since it's common
	 * to ustar and gnu tar?  Is it okay to move it down into
	 * header_common, perhaps?  */
	if (archive_entry_copy_uname_l(entry,
	    header->uname, sizeof(header->uname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Uname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	if (archive_entry_copy_gname_l(entry,
	    header->gname, sizeof(header->gname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Gname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Parse out device numbers only for char and block specials */
	if (header->typeflag[0] == '3' || header->typeflag[0] == '4') {
		archive_entry_set_rdevmajor(entry, (dev_t)
		    tar_atol(header->rdevmajor, sizeof(header->rdevmajor)));
		archive_entry_set_rdevminor(entry, (dev_t)
		    tar_atol(header->rdevminor, sizeof(header->rdevminor)));
	} else
		archive_entry_set_rdev(entry, 0);

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);

	/* Grab GNU-specific fields. */
	t = tar_atol(header->atime, sizeof(header->atime));
	if (t > 0)
		archive_entry_set_atime(entry, t, 0);
	t = tar_atol(header->ctime, sizeof(header->ctime));
	if (t > 0)
		archive_entry_set_ctime(entry, t, 0);

	if (header->realsize[0] != 0) {
		tar->realsize
		    = tar_atol(header->realsize, sizeof(header->realsize));
		archive_entry_set_size(entry, tar->realsize);
	}

	if (header->sparse[0].offset[0] != 0) {
		if (gnu_sparse_old_read(a, tar, header, unconsumed)
		    != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} else {
		if (header->isextended[0] != 0) {
			/* XXX WTF? XXX */
		}
	}

	return (err);
}